

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ShowExampleAppLog(bool *p_open)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char *word;
  char *category;
  int n;
  char *words [7];
  char *categories [3];
  ImGuiWindowFlags in_stack_00000364;
  bool *in_stack_00000368;
  char *in_stack_00000370;
  char *in_stack_ffffffffffffff70;
  undefined8 uVar5;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined8 local_78 [8];
  char *local_38 [3];
  ImVec2 local_1c [3];
  
  if ((ShowExampleAppLog(bool*)::log == '\0') &&
     (iVar3 = __cxa_guard_acquire(&ShowExampleAppLog(bool*)::log), iVar3 != 0)) {
    ExampleAppLog::ExampleAppLog
              ((ExampleAppLog *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    __cxa_atexit(ExampleAppLog::~ExampleAppLog,&ShowExampleAppLog::log,&__dso_handle);
    __cxa_guard_release(&ShowExampleAppLog(bool*)::log);
  }
  ImVec2::ImVec2(local_1c,500.0,400.0);
  ImGui::SetNextWindowSize(local_1c,4);
  ImGui::Begin(in_stack_00000370,in_stack_00000368,in_stack_00000364);
  if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
    (*GImGuiDemoMarkerCallback)
              ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
               ,0x1b2d,"Examples/Log",GImGuiDemoMarkerCallbackUserData);
  }
  bVar2 = ImGui::SmallButton(in_stack_ffffffffffffff70);
  if (bVar2) {
    local_38[0] = "info";
    local_38[1] = "warn";
    local_38[2] = "error";
    memcpy(local_78,&PTR_anon_var_dwarf_46c49_00219ab0,0x38);
    for (iVar3 = 0; iVar3 < 5; iVar3 = iVar3 + 1) {
      pcVar1 = local_38[ShowExampleAppLog::counter % 3];
      uVar5 = local_78[ShowExampleAppLog::counter % 7];
      uVar4 = ImGui::GetFrameCount();
      ImGui::GetTime();
      ExampleAppLog::AddLog
                (&ShowExampleAppLog::log,
                 "[%05d] [%s] Hello, current time is %.1f, here\'s a word: \'%s\'\n",(ulong)uVar4,
                 pcVar1,uVar5);
      ShowExampleAppLog::counter = ShowExampleAppLog::counter + 1;
    }
  }
  ImGui::End();
  ExampleAppLog::Draw((ExampleAppLog *)words[4],words[3],(bool *)words[2]);
  return;
}

Assistant:

static void ShowExampleAppLog(bool* p_open)
{
    static ExampleAppLog log;

    // For the demo: add a debug button _BEFORE_ the normal log window contents
    // We take advantage of a rarely used feature: multiple calls to Begin()/End() are appending to the _same_ window.
    // Most of the contents of the window will be added by the log.Draw() call.
    ImGui::SetNextWindowSize(ImVec2(500, 400), ImGuiCond_FirstUseEver);
    ImGui::Begin("Example: Log", p_open);
    IMGUI_DEMO_MARKER("Examples/Log");
    if (ImGui::SmallButton("[Debug] Add 5 entries"))
    {
        static int counter = 0;
        const char* categories[3] = { "info", "warn", "error" };
        const char* words[] = { "Bumfuzzled", "Cattywampus", "Snickersnee", "Abibliophobia", "Absquatulate", "Nincompoop", "Pauciloquent" };
        for (int n = 0; n < 5; n++)
        {
            const char* category = categories[counter % IM_ARRAYSIZE(categories)];
            const char* word = words[counter % IM_ARRAYSIZE(words)];
            log.AddLog("[%05d] [%s] Hello, current time is %.1f, here's a word: '%s'\n",
                ImGui::GetFrameCount(), category, ImGui::GetTime(), word);
            counter++;
        }
    }
    ImGui::End();

    // Actually call in the regular Log helper (which will Begin() into the same window as we just did)
    log.Draw("Example: Log", p_open);
}